

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spookyv2.cpp
# Opt level: O0

void SpookyHash::Short(void *message,size_t length,uint64 *hash1,uint64 *hash2)

{
  uint64 *end;
  uint64 d;
  uint64 c;
  uint64 b;
  uint64 a;
  size_t remainder;
  anon_union_8_4_fb546f3f u;
  uint64 buf [24];
  uint64 *hash2_local;
  uint64 *hash1_local;
  size_t length_local;
  void *message_local;
  
  a = length & 0x1f;
  b = *hash1;
  c = *hash2;
  d = 0xdeadbeefdeadbeef;
  end = (uint64 *)0xdeadbeefdeadbeef;
  remainder = (size_t)message;
  buf[0x17] = (uint64)hash2;
  if (0xf < length) {
    for (; remainder < (long)message + (length & 0xffffffffffffffe0); remainder = remainder + 0x20)
    {
      d = *(long *)remainder + d;
      end = (uint64 *)(*(long *)(remainder + 8) + (long)end);
      ShortMix(&b,&c,&d,(uint64 *)&end);
      b = *(long *)(remainder + 0x10) + b;
      c = *(long *)(remainder + 0x18) + c;
    }
    if (0xf < a) {
      d = *(long *)remainder + d;
      end = (uint64 *)(*(long *)(remainder + 8) + (long)end);
      ShortMix(&b,&c,&d,(uint64 *)&end);
      remainder = remainder + 0x10;
      a = a - 0x10;
    }
  }
  end = (uint64 *)((long)end + (length << 0x38));
  switch(a) {
  case 0:
    d = d + 0xdeadbeefdeadbeef;
    end = (uint64 *)((long)end + -0x2152411021524111);
    break;
  case 3:
    d = (ulong)*(byte *)(remainder + 2) * 0x10000 + d;
  case 2:
    d = (ulong)*(byte *)(remainder + 1) * 0x100 + d;
  case 1:
    d = *(byte *)remainder + d;
    break;
  case 7:
    d = ((ulong)*(byte *)(remainder + 6) << 0x30) + d;
  case 6:
    d = ((ulong)*(byte *)(remainder + 5) << 0x28) + d;
  case 5:
    d = ((ulong)*(byte *)(remainder + 4) << 0x20) + d;
  case 4:
    d = *(uint *)remainder + d;
    break;
  case 0xb:
    end = end + (ulong)*(byte *)(remainder + 10) * 0x2000;
  case 10:
    end = end + (ulong)*(byte *)(remainder + 9) * 0x20;
  case 9:
    end = (uint64 *)((ulong)*(byte *)(remainder + 8) + (long)end);
  case 8:
    d = *(long *)remainder + d;
    break;
  case 0xf:
    end = (uint64 *)(((ulong)*(byte *)(remainder + 0xe) << 0x30) + (long)end);
  case 0xe:
    end = (uint64 *)(((ulong)*(byte *)(remainder + 0xd) << 0x28) + (long)end);
  case 0xd:
    end = (uint64 *)(((ulong)*(byte *)(remainder + 0xc) << 0x20) + (long)end);
  case 0xc:
    end = (uint64 *)((ulong)*(uint *)(remainder + 8) + (long)end);
    d = *(long *)remainder + d;
  }
  ShortEnd(&b,&c,&d,(uint64 *)&end);
  *hash1 = b;
  *(uint64 *)buf[0x17] = c;
  return;
}

Assistant:

void SpookyHash::Short(
    const void *message,
    size_t length,
    uint64 *hash1,
    uint64 *hash2)
{
    uint64 buf[2*sc_numVars];
    union
    {
        const uint8 *p8;
        uint32 *p32;
        uint64 *p64;
        size_t i;
    } u;

    u.p8 = (const uint8 *)message;

    if (!ALLOW_UNALIGNED_READS && (u.i & 0x7))
    {
        memcpy(buf, message, length);
        u.p64 = buf;
    }

    size_t remainder = length%32;
    uint64 a=*hash1;
    uint64 b=*hash2;
    uint64 c=sc_const;
    uint64 d=sc_const;

    if (length > 15)
    {
        const uint64 *end = u.p64 + (length/32)*4;

        // handle all complete sets of 32 bytes
        for (; u.p64 < end; u.p64 += 4)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            a += u.p64[2];
            b += u.p64[3];
        }

        //Handle the case of 16+ remaining bytes.
        if (remainder >= 16)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            u.p64 += 2;
            remainder -= 16;
        }
    }

    // Handle the last 0..15 bytes, and its length
    d += ((uint64)length) << 56;
    switch (remainder)
    {
    case 15:
    d += ((uint64)u.p8[14]) << 48;
    case 14:
        d += ((uint64)u.p8[13]) << 40;
    case 13:
        d += ((uint64)u.p8[12]) << 32;
    case 12:
        d += u.p32[2];
        c += u.p64[0];
        break;
    case 11:
        d += ((uint64)u.p8[10]) << 16;
    case 10:
        d += ((uint64)u.p8[9]) << 8;
    case 9:
        d += (uint64)u.p8[8];
    case 8:
        c += u.p64[0];
        break;
    case 7:
        c += ((uint64)u.p8[6]) << 48;
    case 6:
        c += ((uint64)u.p8[5]) << 40;
    case 5:
        c += ((uint64)u.p8[4]) << 32;
    case 4:
        c += u.p32[0];
        break;
    case 3:
        c += ((uint64)u.p8[2]) << 16;
    case 2:
        c += ((uint64)u.p8[1]) << 8;
    case 1:
        c += (uint64)u.p8[0];
        break;
    case 0:
        c += sc_const;
        d += sc_const;
    }
    ShortEnd(a,b,c,d);
    *hash1 = a;
    *hash2 = b;
}